

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int emit_label(JSParseState *s,int label)

{
  LabelSlot *in_RAX;
  uint8_t local_14 [4];
  
  if (-1 < label) {
    emit_op(s,0xb4);
    dbuf_put(&s->cur_func->byte_code,local_14,4);
    in_RAX = s->cur_func->label_slots;
    in_RAX[(uint)label].pos = (int)(s->cur_func->byte_code).size;
  }
  return (int)in_RAX;
}

Assistant:

static int emit_label(JSParseState *s, int label)
{
    if (label >= 0) {
        emit_op(s, OP_label);
        emit_u32(s, label);
        s->cur_func->label_slots[label].pos = s->cur_func->byte_code.size;
        return s->cur_func->byte_code.size - 4;
    } else {
        return -1;
    }
}